

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<ProKey,_ProFunctionDef>::emplace_helper<ProFunctionDef>
          (QHash<ProKey,_ProFunctionDef> *this,ProKey *key,ProFunctionDef *args)

{
  int iVar1;
  ProFile *pPVar2;
  ProFile *this_00;
  piter pVar3;
  ProString *this_01;
  long in_FS_OFFSET;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::findOrInsert<ProKey>
            ((InsertionResult *)local_48,this->d,key);
  this_01 = (ProString *)
            ((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries +
            (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
            [(uint)local_48._8_8_ & 0x7f]);
  if (local_48[0x10] == false) {
    ProString::ProString(this_01,&key->super_ProString);
    this_01[1].m_string.d.d = (Data *)args->m_pro;
    *(int *)&this_01[1].m_string.d.ptr = args->m_offset;
    args->m_pro = (ProFile *)0x0;
  }
  else {
    pPVar2 = args->m_pro;
    iVar1 = args->m_offset;
    args->m_pro = (ProFile *)0x0;
    this_00 = (ProFile *)this_01[1].m_string.d.d;
    this_01[1].m_string.d.d = (Data *)pPVar2;
    *(int *)&this_01[1].m_string.d.ptr = iVar1;
    if (this_00 != (ProFile *)0x0) {
      ProFile::deref(this_00);
    }
  }
  pVar3.bucket = local_48._8_8_;
  pVar3.d = (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)local_48._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar3;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }